

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>
               *this,int i)

{
  double dVar1;
  double dVar2;
  Fad<double> *pFVar3;
  double dVar4;
  double dVar5;
  
  dVar1 = (((this->left_->fadexpr_).expr_)->dx_).ptr_to_data[i];
  dVar4 = cos((this->right_->fadexpr_).expr_.fadexpr_.left_.constant_ -
              ((this->right_->fadexpr_).expr_.fadexpr_.right_)->val_);
  pFVar3 = (this->right_->fadexpr_).expr_.fadexpr_.right_;
  dVar2 = (pFVar3->dx_).ptr_to_data[i];
  dVar5 = sin((this->right_->fadexpr_).expr_.fadexpr_.left_.constant_ - pFVar3->val_);
  return dVar4 * -dVar1 - dVar5 * dVar2 * ((this->left_->fadexpr_).expr_)->val_;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}